

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O2

bool __thiscall re2::Prog::IsOnePass(Prog *this)

{
  int *piVar1;
  EmptyOp *pEVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  EmptyOp EVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  int *__s;
  ostream *this_00;
  uint8 *__dest;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  EmptyOp EVar17;
  size_t sVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  size_t sVar22;
  Inst *pIVar23;
  bool bVar24;
  EmptyOp local_240;
  ulong local_230;
  int local_224;
  int *local_210;
  Instq workq;
  Instq tovisit;
  LogMessageFatal local_1b0;
  
  if (this->did_onepass_ == true) {
    bVar24 = this->onepass_start_ != (OneState *)0x0;
  }
  else {
    this->did_onepass_ = true;
    if ((this->start_ != 0) && ((long)this->inst_count_[2] < 0xfde6)) {
      lVar20 = (long)this->inst_count_[2] + 2;
      iVar3 = this->bytemap_range_ * 4 + 4;
      if (lVar20 <= (this->dfa_mem_ / 4) / (long)iVar3) {
        lVar12 = (long)this->inst_count_[6] +
                 (long)this->inst_count_[4] + (long)this->inst_count_[3];
        uVar14 = lVar12 * 8 + 8;
        if ((int)lVar12 < -1) {
          uVar14 = 0xffffffffffffffff;
        }
        piVar13 = (int *)operator_new__(uVar14);
        iVar9 = this->size_;
        sVar22 = (long)iVar9 * 4;
        sVar18 = sVar22;
        if ((long)iVar9 < 0) {
          sVar18 = 0xffffffffffffffff;
        }
        __s = (int *)operator_new__(sVar18);
        memset(__s,0xff,sVar22);
        iVar19 = (int)lVar20;
        iVar7 = iVar3 * iVar19;
        iVar11 = -1;
        if (-1 < iVar7) {
          iVar11 = iVar7;
        }
        local_210 = (int *)operator_new__((long)iVar11);
        SparseSet::SparseSet(&tovisit,iVar9);
        SparseSet::SparseSet(&workq,iVar9);
        AddQ(&tovisit,this->start_);
        __s[this->start_] = 0;
        local_224 = 1;
        piVar15 = tovisit.dense_;
        do {
          piVar1 = tovisit.dense_ + tovisit.size_;
          if (piVar15 == piVar1) {
            sVar22 = (size_t)(local_224 * iVar3);
            uVar14 = 0xffffffffffffffff;
            if (-1 < local_224 * iVar3) {
              uVar14 = sVar22;
            }
            __dest = (uint8 *)operator_new__(uVar14);
            memcpy(__dest,local_210,sVar22);
            operator_delete__(local_210);
            this->onepass_start_ = (OneState *)(__dest + (long)__s[this->start_] * (long)iVar3);
            this->onepass_nodes_ = __dest;
            this->onepass_statesize_ = iVar3;
            this->dfa_mem_ = this->dfa_mem_ - sVar22;
            local_210 = __s;
LAB_00130b56:
            operator_delete__(piVar13);
            operator_delete__(local_210);
            SparseSet::~SparseSet(&workq);
            SparseSet::~SparseSet(&tovisit);
            return piVar15 == piVar1;
          }
          iVar9 = *piVar15;
          pEVar2 = (EmptyOp *)((long)local_210 + (long)(__s[iVar9] * iVar3));
          lVar20 = (long)(__s[iVar9] * iVar3) + 4;
          uVar14 = (ulong)(uint)this->bytemap_range_;
          if (this->bytemap_range_ < 1) {
            uVar14 = 0;
          }
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            *(undefined4 *)((long)local_210 + uVar16 * 4 + lVar20) = 0x30;
          }
          workq.size_ = 0;
          *piVar13 = iVar9;
          piVar13[1] = 0;
          *pEVar2 = kEmptyNonWordBoundary|kEmptyWordBoundary;
          bVar24 = false;
          local_230 = 1;
LAB_001307d4:
          if (0 < (int)local_230) {
            local_230 = (ulong)((int)local_230 - 1);
            uVar21 = piVar13[local_230 * 2];
            local_240 = piVar13[local_230 * 2 + 1];
LAB_001307f0:
            lVar12 = (long)(int)uVar21 << 3;
            do {
              uVar21 = uVar21 + 1;
              pIVar23 = this->inst_;
              uVar8 = *(uint *)((long)&pIVar23->out_opcode_ + lVar12);
              switch(uVar8 & 7) {
              case 0:
                LogMessageFatal::LogMessageFatal
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc"
                           ,0x1b4);
                this_00 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                                          "unhandled opcode: ");
                std::ostream::operator<<
                          (this_00,*(uint *)((long)&pIVar23->out_opcode_ + lVar12) & 7);
                LogMessageFatal::~LogMessageFatal(&local_1b0);
                goto LAB_001307d4;
              case 1:
                if ((uVar8 & 8) != 0) {
                  __assert_fail("!ip->last()",
                                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc"
                                ,0x1ba,"bool re2::Prog::IsOnePass()");
                }
                bVar6 = AddQ(&workq,uVar21);
                lVar12 = lVar12 + 8;
                if (!bVar6) goto LAB_00130b47;
                break;
              case 2:
                goto switchD_00130815_caseD_2;
              default:
                pIVar23 = (Inst *)((long)&pIVar23->out_opcode_ + lVar12);
                if ((uVar8 & 8) == 0) {
                  bVar6 = AddQ(&workq,uVar21);
                  if (!bVar6) goto LAB_00130b47;
                  lVar12 = (long)(int)local_230;
                  piVar13[lVar12 * 2] = uVar21;
                  local_230 = (ulong)((int)local_230 + 1);
                  piVar13[lVar12 * 2 + 1] = local_240;
                  uVar8 = pIVar23->out_opcode_;
                }
                if (((uVar8 & 7) == 3) && (iVar9 = Inst::cap(pIVar23), iVar9 < 10)) {
                  iVar9 = Inst::cap(pIVar23);
                  local_240 = local_240 | 0x20 << ((byte)iVar9 & 0x1f);
                }
                uVar21 = pIVar23->out_opcode_;
                if ((uVar21 & 7) == 4) {
                  EVar10 = Inst::empty(pIVar23);
                  local_240 = local_240 | EVar10;
                  uVar21 = pIVar23->out_opcode_;
                }
                bVar6 = AddQ(&workq,uVar21 >> 4);
                if (!bVar6) goto LAB_00130b47;
                uVar21 = pIVar23->out_opcode_ >> 4;
                goto LAB_001307f0;
              case 5:
                if (bVar24) goto LAB_00130b47;
                *pEVar2 = local_240;
                if ((*(byte *)((long)&pIVar23->out_opcode_ + lVar12) & 8) == 0) {
                  bVar6 = AddQ(&workq,uVar21);
                  bVar24 = true;
                  goto LAB_00130aa8;
                }
                bVar24 = true;
              case 7:
                goto switchD_00130815_caseD_7;
              }
            } while( true );
          }
          piVar15 = piVar15 + 1;
        } while( true );
      }
    }
    bVar24 = false;
  }
  return bVar24;
switchD_00130815_caseD_2:
  pIVar23 = (Inst *)((long)&pIVar23->out_opcode_ + lVar12);
  iVar9 = __s[uVar8 >> 4];
  if (iVar9 == -1) {
    if (iVar19 <= local_224) goto LAB_00130b47;
    __s[uVar8 >> 4] = local_224;
    AddQ(&tovisit,pIVar23->out_opcode_ >> 4);
    iVar9 = local_224;
    local_224 = local_224 + 1;
  }
  iVar11 = Inst::lo(pIVar23);
  EVar17 = iVar9 << 0x10 | local_240;
  EVar10 = EVar17 | 0x40;
  if (!bVar24) {
    EVar10 = EVar17;
  }
  for (; iVar9 = Inst::hi(pIVar23), iVar11 <= iVar9; iVar11 = iVar11 + 1) {
    bVar4 = this->bytemap_[iVar11];
    iVar9 = 0xff;
    if (0xff < iVar11) {
      iVar9 = iVar11;
    }
    iVar7 = iVar11 + -1;
    lVar12 = (long)iVar11;
    do {
      iVar11 = iVar9;
      if (0xfe < lVar12) break;
      iVar7 = iVar7 + 1;
      lVar5 = lVar12 + 1;
      lVar12 = lVar12 + 1;
      iVar11 = iVar7;
    } while (this->bytemap_[lVar5] == bVar4);
    EVar17 = *(EmptyOp *)((long)local_210 + (ulong)bVar4 * 4 + lVar20);
    if ((~EVar17 & 0x30) == 0) {
      *(EmptyOp *)((long)local_210 + (ulong)bVar4 * 4 + lVar20) = EVar10;
    }
    else if (EVar17 != EVar10) goto LAB_00130b47;
  }
  iVar9 = Inst::foldcase(pIVar23);
  if (iVar9 != 0) {
    iVar9 = Inst::lo(pIVar23);
    if (iVar9 < 0x62) {
      iVar9 = 0x61;
    }
    uVar14 = (ulong)(iVar9 - 0x20);
    iVar9 = Inst::hi(pIVar23);
    if (0x79 < iVar9) {
      iVar9 = 0x7a;
    }
    while (iVar11 = (int)uVar14, iVar11 <= iVar9 + -0x20) {
      bVar4 = this->bytemap_[iVar11];
      uVar16 = (long)iVar11;
      do {
        if (0xfe < (long)uVar16) {
          uVar14 = 0x100;
          break;
        }
        uVar14 = uVar16 + 1;
        lVar12 = uVar16 + 1;
        uVar16 = uVar14;
      } while (this->bytemap_[lVar12] == bVar4);
      EVar17 = *(EmptyOp *)((long)local_210 + (ulong)bVar4 * 4 + lVar20);
      if ((~EVar17 & 0x30) == 0) {
        *(EmptyOp *)((long)local_210 + (ulong)bVar4 * 4 + lVar20) = EVar10;
      }
      else if (EVar17 != EVar10) goto LAB_00130b47;
    }
  }
  if ((pIVar23->out_opcode_ & 8) != 0) goto switchD_00130815_caseD_7;
  bVar6 = AddQ(&workq,uVar21);
LAB_00130aa8:
  if (bVar6 != false) goto LAB_001307f0;
LAB_00130b47:
  operator_delete__(piVar13);
  piVar13 = __s;
  goto LAB_00130b56;
switchD_00130815_caseD_7:
  goto LAB_001307d4;
}

Assistant:

bool Prog::IsOnePass() {
  if (did_onepass_)
    return onepass_start_ != NULL;
  did_onepass_ = true;

  if (start() == 0)  // no match
    return false;

  // Steal memory for the one-pass NFA from the overall DFA budget.
  // Willing to use at most 1/4 of the DFA budget (heuristic).
  // Limit max node count to 65000 as a conservative estimate to
  // avoid overflowing 16-bit node index in encoding.
  int maxnodes = 2 + inst_count(kInstByteRange);
  int statesize = sizeof(OneState) + bytemap_range_*sizeof(uint32);
  if (maxnodes >= 65000 || dfa_mem_ / 4 / statesize < maxnodes)
    return false;

  // Flood the graph starting at the start state, and check
  // that in each reachable state, each possible byte leads
  // to a unique next state.
  int stacksize = inst_count(kInstCapture) +
                  inst_count(kInstEmptyWidth) +
                  inst_count(kInstNop) + 1;  // + 1 for start inst
  InstCond* stack = new InstCond[stacksize];

  int size = this->size();
  int* nodebyid = new int[size];  // indexed by ip
  memset(nodebyid, 0xFF, size*sizeof nodebyid[0]);

  uint8* nodes = new uint8[maxnodes*statesize];
  uint8* nodep = nodes;

  Instq tovisit(size), workq(size);
  AddQ(&tovisit, start());
  nodebyid[start()] = 0;
  nodep += statesize;
  int nalloc = 1;
  for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
    int id = *it;
    int nodeindex = nodebyid[id];
    OneState* node = IndexToNode(nodes, statesize, nodeindex);

    // Flood graph using manual stack, filling in actions as found.
    // Default is none.
    for (int b = 0; b < bytemap_range_; b++)
      node->action[b] = kImpossible;
    node->matchcond = kImpossible;

    workq.clear();
    bool matched = false;
    int nstack = 0;
    stack[nstack].id = id;
    stack[nstack++].cond = 0;
    while (nstack > 0) {
      int id = stack[--nstack].id;
      uint32 cond = stack[nstack].cond;

    Loop:
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
          break;

        case kInstAltMatch:
          // TODO(rsc): Ignoring kInstAltMatch optimization.
          // Should implement it in this engine, but it's subtle.
          DCHECK(!ip->last());
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstByteRange: {
          int nextindex = nodebyid[ip->out()];
          if (nextindex == -1) {
            if (nalloc >= maxnodes) {
              if (Debug)
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: hit node limit %d > %d", nalloc, maxnodes);
              goto fail;
            }
            nextindex = nalloc;
            nodep += statesize;
            nodebyid[ip->out()] = nextindex;
            nalloc++;
            AddQ(&tovisit, ip->out());
          }
          for (int c = ip->lo(); c <= ip->hi(); c++) {
            int b = bytemap_[c];
            // Skip any bytes immediately after c that are also in b.
            while (c < 256-1 && bytemap_[c+1] == b)
              c++;
            uint32 act = node->action[b];
            uint32 newact = (nextindex << kIndexShift) | cond;
            if (matched)
              newact |= kMatchWins;
            if ((act & kImpossible) == kImpossible) {
              node->action[b] = newact;
            } else if (act != newact) {
              if (Debug) {
                LOG(ERROR) << StringPrintf(
                    "Not OnePass: conflict on byte %#x at state %d", c, *it);
              }
              goto fail;
            }
          }
          if (ip->foldcase()) {
            Rune lo = max<Rune>(ip->lo(), 'a') + 'A' - 'a';
            Rune hi = min<Rune>(ip->hi(), 'z') + 'A' - 'a';
            for (int c = lo; c <= hi; c++) {
              int b = bytemap_[c];
              // Skip any bytes immediately after c that are also in b.
              while (c < 256-1 && bytemap_[c+1] == b)
                c++;
              uint32 act = node->action[b];
              uint32 newact = (nextindex << kIndexShift) | cond;
              if (matched)
                newact |= kMatchWins;
              if ((act & kImpossible) == kImpossible) {
                node->action[b] = newact;
              } else if (act != newact) {
                if (Debug) {
                  LOG(ERROR) << StringPrintf(
                      "Not OnePass: conflict on byte %#x at state %d", c, *it);
                }
                goto fail;
              }
            }
          }

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;
        }

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last()) {
            // If already on work queue, (1) is violated: bail out.
            if (!AddQ(&workq, id+1))
              goto fail;
            stack[nstack].id = id+1;
            stack[nstack++].cond = cond;
          }

          if (ip->opcode() == kInstCapture && ip->cap() < kMaxCap)
            cond |= (1 << kCapShift) << ip->cap();
          if (ip->opcode() == kInstEmptyWidth)
            cond |= ip->empty();

          // kInstCapture and kInstNop always proceed to ip->out().
          // kInstEmptyWidth only sometimes proceeds to ip->out(),
          // but as a conservative approximation we assume it always does.
          // We could be a little more precise by looking at what c
          // is, but that seems like overkill.

          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, ip->out())) {
            if (Debug) {
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple paths %d -> %d\n", *it, ip->out());
            }
            goto fail;
          }
          id = ip->out();
          goto Loop;

        case kInstMatch:
          if (matched) {
            // (3) is violated
            if (Debug) {
              LOG(ERROR) << StringPrintf(
                  "Not OnePass: multiple matches from %d\n", *it);
            }
            goto fail;
          }
          matched = true;
          node->matchcond = cond;

          if (ip->last())
            break;
          // If already on work queue, (1) is violated: bail out.
          if (!AddQ(&workq, id+1))
            goto fail;
          id = id+1;
          goto Loop;

        case kInstFail:
          break;
      }
    }
  }

  if (Debug) {  // For debugging, dump one-pass NFA to LOG(ERROR).
    LOG(ERROR) << "bytemap:\n" << DumpByteMap();
    LOG(ERROR) << "prog:\n" << Dump();

    map<int, int> idmap;
    for (int i = 0; i < size; i++)
      if (nodebyid[i] != -1)
        idmap[nodebyid[i]] = i;

    string dump;
    for (Instq::iterator it = tovisit.begin(); it != tovisit.end(); ++it) {
      int id = *it;
      int nodeindex = nodebyid[id];
      if (nodeindex == -1)
        continue;
      OneState* node = IndexToNode(nodes, statesize, nodeindex);
      StringAppendF(&dump, "node %d id=%d: matchcond=%#x\n",
                    nodeindex, id, node->matchcond);
      for (int i = 0; i < bytemap_range_; i++) {
        if ((node->action[i] & kImpossible) == kImpossible)
          continue;
        StringAppendF(&dump, "  %d cond %#x -> %d id=%d\n",
                      i, node->action[i] & 0xFFFF,
                      node->action[i] >> kIndexShift,
                      idmap[node->action[i] >> kIndexShift]);
      }
    }
    LOG(ERROR) << "nodes:\n" << dump;
  }

  // Overallocated earlier; cut down to actual size.
  nodep = new uint8[nalloc*statesize];
  memmove(nodep, nodes, nalloc*statesize);
  delete[] nodes;
  nodes = nodep;

  onepass_start_ = IndexToNode(nodes, statesize, nodebyid[start()]);
  onepass_nodes_ = nodes;
  onepass_statesize_ = statesize;
  dfa_mem_ -= nalloc*statesize;

  delete[] stack;
  delete[] nodebyid;
  return true;

fail:
  delete[] stack;
  delete[] nodebyid;
  delete[] nodes;
  return false;
}